

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_optTests.cpp
# Opt level: O2

void __thiscall
shared_guarded_opt_shared_guarded_1_Test::TestBody(shared_guarded_opt_shared_guarded_1_Test *this)

{
  char *pcVar1;
  char *in_R9;
  atomic<bool> th3_ok;
  atomic<bool> th2_ok;
  atomic<bool> th1_ok;
  thread th1;
  AssertHelper local_e0;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_d8;
  thread th2;
  handle data_handle;
  AssertionResult gtest_ar_;
  thread th3;
  handle data_handle_1;
  shared_guarded_opt<int,_std::shared_timed_mutex> data;
  
  data.m_obj = 0;
  data.m_mutex.super___shared_timed_mutex_base._M_rwlock.__align = 0;
  data.m_mutex.super___shared_timed_mutex_base._M_rwlock._8_8_ = 0;
  data.m_mutex.super___shared_timed_mutex_base._M_rwlock._16_8_ = 0;
  data.m_mutex.super___shared_timed_mutex_base._M_rwlock._24_8_ = 0;
  data.m_mutex.super___shared_timed_mutex_base._M_rwlock._32_8_ = 0;
  data.m_mutex.super___shared_timed_mutex_base._M_rwlock.__data.__pad2 = 0;
  data.m_mutex.super___shared_timed_mutex_base._M_rwlock._48_8_ = 0;
  data.enabled = true;
  gmlc::libguarded::shared_guarded_opt<int,_std::shared_timed_mutex>::lock(&data_handle,&data);
  *data_handle.data = *data_handle.data + 1;
  std::unique_lock<std::shared_timed_mutex>::~unique_lock(&data_handle.m_handle_lock);
  gmlc::libguarded::shared_guarded_opt<int,_std::shared_timed_mutex>::try_lock(&data_handle_1,&data)
  ;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = data_handle_1.data != (pointer)0x0;
  if (data_handle_1.data == (pointer)0x0) {
    testing::Message::Message((Message *)&th1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)0x1442d7,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x2e,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th2,(Message *)&th1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th2);
    std::__cxx11::string::~string((string *)&data_handle);
    if (th1._M_id._M_thread != 0) {
      (**(code **)(*(long *)th1._M_id._M_thread + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&data_handle,"*data_handle","1",data_handle_1.data,(int *)&gtest_ar_);
  if ((char)data_handle.data == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (data_handle.m_handle_lock._M_device == (mutex_type *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (char *)((data_handle.m_handle_lock._M_device)->super___shared_timed_mutex_base).
                       _M_rwlock.__align;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x2f,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th1,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th1);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&data_handle.m_handle_lock);
  th1_ok._M_base._M_i = (__atomic_base<bool>)true;
  th2_ok._M_base._M_i = (__atomic_base<bool>)true;
  th3_ok._M_base._M_i = (__atomic_base<bool>)true;
  th1._M_id._M_thread = (id)0;
  data_handle.data = (pointer)operator_new(0x18);
  *(undefined ***)data_handle.data = &PTR___State_0016c6c0;
  *(shared_guarded_opt<int,_std::shared_timed_mutex> **)(data_handle.data + 2) = &data;
  *(atomic<bool> **)(data_handle.data + 4) = &th1_ok;
  std::thread::_M_start_thread(&th1,&data_handle,0);
  if (data_handle.data != (pointer)0x0) {
    (**(code **)(*(long *)data_handle.data + 8))();
  }
  th2._M_id._M_thread = (id)0;
  data_handle.data = (pointer)operator_new(0x18);
  *(undefined ***)data_handle.data = &PTR___State_0016c700;
  *(shared_guarded_opt<int,_std::shared_timed_mutex> **)(data_handle.data + 2) = &data;
  *(atomic<bool> **)(data_handle.data + 4) = &th2_ok;
  std::thread::_M_start_thread(&th2,&data_handle,0);
  if (data_handle.data != (pointer)0x0) {
    (**(code **)(*(long *)data_handle.data + 8))();
  }
  th3._M_id._M_thread = (id)0;
  data_handle.data = (pointer)operator_new(0x18);
  *(undefined ***)data_handle.data = &PTR___State_0016c740;
  *(shared_guarded_opt<int,_std::shared_timed_mutex> **)(data_handle.data + 2) = &data;
  *(atomic<bool> **)(data_handle.data + 4) = &th3_ok;
  std::thread::_M_start_thread(&th3,&data_handle,0);
  if (data_handle.data != (pointer)0x0) {
    (**(code **)(*(long *)data_handle.data + 8))();
  }
  std::thread::join();
  std::thread::join();
  std::thread::join();
  gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,th1_ok._M_base._M_i) & 0xffffff01;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (((byte)th1_ok._M_base._M_i & 1) == 0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)"th1_ok == true",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x54,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&data_handle);
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,th2_ok._M_base._M_i) & 0xffffff01;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (((byte)th2_ok._M_base._M_i & 1) == 0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)"th2_ok == true",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x55,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&data_handle);
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,th3_ok._M_base._M_i) & 0xffffff01;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (((byte)th3_ok._M_base._M_i & 1) == 0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)"th3_ok == true",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x56,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&data_handle);
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::thread::~thread(&th3);
  std::thread::~thread(&th2);
  std::thread::~thread(&th1);
  std::unique_lock<std::shared_timed_mutex>::~unique_lock(&data_handle_1.m_handle_lock);
  gmlc::libguarded::shared_guarded_opt<int,_std::shared_timed_mutex>::try_lock(&data_handle_1,&data)
  ;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = data_handle_1.data != (pointer)0x0;
  if (data_handle_1.data == (pointer)0x0) {
    testing::Message::Message((Message *)&th1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)0x1442d7,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x5c,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th2,(Message *)&th1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th2);
    std::__cxx11::string::~string((string *)&data_handle);
    if (th1._M_id._M_thread != 0) {
      (**(code **)(*(long *)th1._M_id._M_thread + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&data_handle,"*data_handle","1",data_handle_1.data,(int *)&gtest_ar_);
  if ((char)data_handle.data == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (data_handle.m_handle_lock._M_device == (mutex_type *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (char *)((data_handle.m_handle_lock._M_device)->super___shared_timed_mutex_base).
                       _M_rwlock.__align;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x5d,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th1,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th1);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&data_handle.m_handle_lock);
  th1_ok._M_base._M_i = (__atomic_base<bool>)true;
  th2_ok._M_base._M_i = (__atomic_base<bool>)true;
  th3_ok._M_base._M_i = (__atomic_base<bool>)true;
  th1._M_id._M_thread = (id)0;
  data_handle.data = (pointer)operator_new(0x18);
  *(undefined ***)data_handle.data = &PTR___State_0016c780;
  *(shared_guarded_opt<int,_std::shared_timed_mutex> **)(data_handle.data + 2) = &data;
  *(atomic<bool> **)(data_handle.data + 4) = &th1_ok;
  std::thread::_M_start_thread(&th1,&data_handle,0);
  if (data_handle.data != (pointer)0x0) {
    (**(code **)(*(long *)data_handle.data + 8))();
  }
  th2._M_id._M_thread = (id)0;
  data_handle.data = (pointer)operator_new(0x18);
  *(undefined ***)data_handle.data = &PTR___State_0016c7c0;
  *(shared_guarded_opt<int,_std::shared_timed_mutex> **)(data_handle.data + 2) = &data;
  *(atomic<bool> **)(data_handle.data + 4) = &th2_ok;
  std::thread::_M_start_thread(&th2,&data_handle,0);
  if (data_handle.data != (pointer)0x0) {
    (**(code **)(*(long *)data_handle.data + 8))();
  }
  th3._M_id._M_thread = (id)0;
  data_handle.data = (pointer)operator_new(0x18);
  *(undefined ***)data_handle.data = &PTR___State_0016c800;
  *(shared_guarded_opt<int,_std::shared_timed_mutex> **)(data_handle.data + 2) = &data;
  *(atomic<bool> **)(data_handle.data + 4) = &th3_ok;
  std::thread::_M_start_thread(&th3,&data_handle,0);
  if (data_handle.data != (pointer)0x0) {
    (**(code **)(*(long *)data_handle.data + 8))();
  }
  std::thread::join();
  std::thread::join();
  std::thread::join();
  gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,th1_ok._M_base._M_i) & 0xffffff01;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (((byte)th1_ok._M_base._M_i & 1) == 0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)"th1_ok == true",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x7f,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&data_handle);
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,th2_ok._M_base._M_i) & 0xffffff01;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (((byte)th2_ok._M_base._M_i & 1) == 0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)"th2_ok == true",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x80,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&data_handle);
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,th3_ok._M_base._M_i) & 0xffffff01;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (((byte)th3_ok._M_base._M_i & 1) == 0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)"th3_ok == true",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x81,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&data_handle);
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::thread::~thread(&th3);
  std::thread::~thread(&th2);
  std::thread::~thread(&th1);
  std::unique_lock<std::shared_timed_mutex>::~unique_lock(&data_handle_1.m_handle_lock);
  gmlc::libguarded::shared_guarded_opt<int,_std::shared_timed_mutex>::lock_shared
            ((shared_handle *)&data_handle_1,&data);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = data_handle_1.data != (pointer)0x0;
  if (data_handle_1.data == (pointer)0x0) {
    testing::Message::Message((Message *)&th1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)0x1442d7,"false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x87,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th2,(Message *)&th1);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th2);
    std::__cxx11::string::~string((string *)&data_handle);
    if (th1._M_id._M_thread != 0) {
      (**(code **)(*(long *)th1._M_id._M_thread + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_.success_ = true;
  gtest_ar_._1_3_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&data_handle,"*data_handle","1",data_handle_1.data,(int *)&gtest_ar_);
  if ((char)data_handle.data == '\0') {
    testing::Message::Message((Message *)&gtest_ar_);
    if (data_handle.m_handle_lock._M_device == (mutex_type *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (char *)((data_handle.m_handle_lock._M_device)->super___shared_timed_mutex_base).
                       _M_rwlock.__align;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&th1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0x88,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&th1,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&th1);
    if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&data_handle.m_handle_lock);
  th1_ok._M_base._M_i = (__atomic_base<bool>)true;
  th2_ok._M_base._M_i = (__atomic_base<bool>)true;
  th3_ok._M_base._M_i = (__atomic_base<bool>)true;
  th1._M_id._M_thread = (id)0;
  data_handle.data = (pointer)operator_new(0x18);
  *(undefined ***)data_handle.data = &PTR___State_0016c840;
  *(shared_guarded_opt<int,_std::shared_timed_mutex> **)(data_handle.data + 2) = &data;
  *(atomic<bool> **)(data_handle.data + 4) = &th1_ok;
  std::thread::_M_start_thread(&th1,&data_handle,0);
  if (data_handle.data != (pointer)0x0) {
    (**(code **)(*(long *)data_handle.data + 8))();
  }
  th2._M_id._M_thread = (id)0;
  data_handle.data = (pointer)operator_new(0x18);
  *(undefined ***)data_handle.data = &PTR___State_0016c880;
  *(shared_guarded_opt<int,_std::shared_timed_mutex> **)(data_handle.data + 2) = &data;
  *(atomic<bool> **)(data_handle.data + 4) = &th2_ok;
  std::thread::_M_start_thread(&th2,&data_handle,0);
  if (data_handle.data != (pointer)0x0) {
    (**(code **)(*(long *)data_handle.data + 8))();
  }
  th3._M_id._M_thread = (id)0;
  data_handle.data = (pointer)operator_new(0x18);
  *(undefined ***)data_handle.data = &PTR___State_0016c8c0;
  *(shared_guarded_opt<int,_std::shared_timed_mutex> **)(data_handle.data + 2) = &data;
  *(atomic<bool> **)(data_handle.data + 4) = &th3_ok;
  std::thread::_M_start_thread(&th3,&data_handle,0);
  if (data_handle.data != (pointer)0x0) {
    (**(code **)(*(long *)data_handle.data + 8))();
  }
  std::thread::join();
  std::thread::join();
  std::thread::join();
  gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,th1_ok._M_base._M_i) & 0xffffff01;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (((byte)th1_ok._M_base._M_i & 1) == 0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)"th1_ok == true",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0xb3,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&data_handle);
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,th2_ok._M_base._M_i) & 0xffffff01;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (((byte)th2_ok._M_base._M_i & 1) == 0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)"th2_ok == true",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0xb4,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&data_handle);
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  gtest_ar_._0_4_ = CONCAT31(gtest_ar_._1_3_,th3_ok._M_base._M_i) & 0xffffff01;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (((byte)th3_ok._M_base._M_i & 1) == 0) {
    testing::Message::Message((Message *)&local_d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&data_handle,(internal *)&gtest_ar_,(AssertionResult *)"th3_ok == true",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/shared_guarded_optTests.cpp"
               ,0xb5,(char *)data_handle.data);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    std::__cxx11::string::~string((string *)&data_handle);
    if (local_d8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_d8._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::thread::~thread(&th3);
  std::thread::~thread(&th2);
  std::thread::~thread(&th1);
  std::shared_lock<std::shared_timed_mutex>::~shared_lock
            ((shared_lock<std::shared_timed_mutex> *)&data_handle_1.m_handle_lock);
  return;
}

Assistant:

TEST(shared_guarded_opt, shared_guarded_1)
{
    shared_guarded_opt<int, shared_mutex> data(true, 0);

    {
        auto data_handle = data.lock();

        ++(*data_handle);
    }

    {
        auto data_handle = data.try_lock();

        EXPECT_TRUE(data_handle);
        EXPECT_EQ(*data_handle, 1);

        /* These tests must be done from another thread, because on
           glibc std::mutex is actually a recursive mutex. */

        std::atomic<bool> th1_ok(true);
        std::atomic<bool> th2_ok(true);
        std::atomic<bool> th3_ok(true);

        std::thread th1([&]() {
            auto data_handle2 = data.try_lock();
            if (data_handle2) {
                th1_ok = false;
            }
        });

        std::thread th2([&]() {
            auto data_handle2 =
                data.try_lock_for(std::chrono::milliseconds(20));
            if (data_handle2) {
                th2_ok = false;
            }
        });

        std::thread th3([&]() {
            auto data_handle2 =
                data.try_lock_until(std::chrono::steady_clock::now() +
                                    std::chrono::milliseconds(20));
            if (data_handle2) {
                th3_ok = false;
            }
        });

        th1.join();
        th2.join();
        th3.join();

        EXPECT_TRUE(th1_ok == true);
        EXPECT_TRUE(th2_ok == true);
        EXPECT_TRUE(th3_ok == true);
    }

    {
        auto data_handle = data.try_lock();

        EXPECT_TRUE(data_handle);
        EXPECT_EQ(*data_handle, 1);

        std::atomic<bool> th1_ok(true);
        std::atomic<bool> th2_ok(true);
        std::atomic<bool> th3_ok(true);

        std::thread th1([&]() {
            auto data_handle2 = data.try_lock_shared();
            if (data_handle2) {
                th1_ok = false;
            }
        });

        std::thread th2([&]() {
            auto data_handle2 =
                data.try_lock_shared_for(std::chrono::milliseconds(20));
            if (data_handle2) {
                th2_ok = false;
            }
        });

        std::thread th3([&]() {
            auto data_handle2 =
                data.try_lock_shared_until(std::chrono::steady_clock::now() +
                                           std::chrono::milliseconds(20));
            if (data_handle2) {
                th3_ok = false;
            }
        });

        th1.join();
        th2.join();
        th3.join();

        EXPECT_TRUE(th1_ok == true);
        EXPECT_TRUE(th2_ok == true);
        EXPECT_TRUE(th3_ok == true);
    }

    {
        auto data_handle = data.lock_shared();

        EXPECT_TRUE(data_handle);
        EXPECT_EQ(*data_handle, 1);

        std::atomic<bool> th1_ok(true);
        std::atomic<bool> th2_ok(true);
        std::atomic<bool> th3_ok(true);

        std::thread th1([&]() {
            auto data_handle2 = data.try_lock_shared();
            if (!data_handle2) {
                th1_ok = false;
            }
            if (*data_handle2 != 1) {
                th1_ok = false;
            }
        });

        std::thread th2([&]() {
            auto data_handle2 =
                data.try_lock_shared_for(std::chrono::milliseconds(20));
            if (!data_handle2) {
                th2_ok = false;
            }
            if (*data_handle2 != 1) {
                th2_ok = false;
            }
        });

        std::thread th3([&]() {
            auto data_handle2 =
                data.try_lock_shared_until(std::chrono::steady_clock::now() +
                                           std::chrono::milliseconds(20));
            if (!data_handle2) {
                th3_ok = false;
            }
            if (*data_handle2 != 1) {
                th3_ok = false;
            }
        });

        th1.join();
        th2.join();
        th3.join();

        EXPECT_TRUE(th1_ok == true);
        EXPECT_TRUE(th2_ok == true);
        EXPECT_TRUE(th3_ok == true);
    }
}